

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satUtil.c
# Opt level: O3

int Sat_Solver2GetVarMem(sat_solver2 *s)

{
  return 0x40;
}

Assistant:

int Sat_Solver2GetVarMem( sat_solver2 * s )
{
    int Mem = 0;
    Mem += (sizeof(s->activity[0]) == 4) ? sizeof(unsigned) : sizeof(double);  // activity
    Mem += 2 * sizeof(veci); // wlists
    Mem += sizeof(int);      // vi (variable info)
    Mem += sizeof(int);      // trail
    Mem += sizeof(int);      // orderpos
    Mem += sizeof(int);      // reasons
    Mem += sizeof(int);      // units
    Mem += sizeof(int);      // order
    Mem += sizeof(int);      // model
    return Mem;
}